

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t assertion_make_file(char *file,wchar_t line,char *path,wchar_t mode,wchar_t csize,
                           void *contents)

{
  int __fd;
  size_t __n;
  size_t sVar1;
  ulong uVar2;
  char *fmt;
  wchar_t wVar3;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  uVar2 = 0x1a4;
  if (L'\xffffffff' < mode) {
    uVar2 = (ulong)(uint)mode;
  }
  __fd = open(path,0x41,uVar2);
  if (__fd < 0) {
    fmt = "Could not create %s";
LAB_0011d377:
    wVar3 = L'\0';
    failure_start(file,line,fmt,path);
    failure_finish((void *)0x0);
  }
  else {
    if (contents != (void *)0x0) {
      if (csize < L'\0') {
        __n = strlen((char *)contents);
      }
      else {
        __n = (size_t)(uint)csize;
      }
      sVar1 = write(__fd,contents,__n);
      if (__n != sVar1) {
        close(__fd);
        fmt = "Could not write to %s";
        goto LAB_0011d377;
      }
    }
    close(__fd);
    wVar3 = L'\x01';
  }
  return wVar3;
}

Assistant:

int
assertion_make_file(const char *file, int line,
    const char *path, int mode, int csize, const void *contents)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: Rework this to set file mode as well. */
	FILE *f;
	(void)mode; /* UNUSED */
	assertion_count(file, line);
	f = fopen(path, "wb");
	if (f == NULL) {
		failure_start(file, line, "Could not create file %s", path);
		failure_finish(NULL);
		return (0);
	}
	if (contents != NULL) {
		size_t wsize;

		if (csize < 0)
			wsize = strlen(contents);
		else
			wsize = (size_t)csize;
		if (wsize != fwrite(contents, 1, wsize, f)) {
			fclose(f);
			failure_start(file, line,
			    "Could not write file %s", path);
			failure_finish(NULL);
			return (0);
		}
	}
	fclose(f);
	return (1);
#else
	int fd;
	assertion_count(file, line);
	fd = open(path, O_CREAT | O_WRONLY, mode >= 0 ? mode : 0644);
	if (fd < 0) {
		failure_start(file, line, "Could not create %s", path);
		failure_finish(NULL);
		return (0);
	}
	if (contents != NULL) {
		ssize_t wsize;

		if (csize < 0)
			wsize = (ssize_t)strlen(contents);
		else
			wsize = (ssize_t)csize;
		if (wsize != write(fd, contents, wsize)) {
			close(fd);
			failure_start(file, line,
			    "Could not write to %s", path);
			failure_finish(NULL);
			return (0);
		}
	}
	close(fd);
	return (1);
#endif
}